

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O0

void txvalidationcache_tests::ValidateCheckInputsForAllFlags
               (CTransaction *tx,uint32_t failing_flags,bool add_to_cache,
               CCoinsViewCache *active_coins_tip,ValidationCache *validation_cache)

{
  bool bVar1;
  byte in_DL;
  uint in_ESI;
  unit_test_log_t *in_RDI;
  lazy_ostream *in_R8;
  long in_FS_OFFSET;
  uint32_t test_flags;
  int count;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks_1;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  bool expected_return_value;
  bool ret;
  TxValidationState state;
  FastRandomContext insecure_rand;
  PrecomputedTransactionData txdata;
  char *in_stack_fffffffffffff588;
  basic_cstring<const_char> *pbVar2;
  undefined8 in_stack_fffffffffffff590;
  undefined1 fDeterministic;
  lazy_ostream *prev;
  FastRandomContext *in_stack_fffffffffffff598;
  char *this;
  uint in_stack_fffffffffffff5ac;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff5b0;
  lazy_ostream *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  unit_test_log_t *in_stack_fffffffffffff5c8;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff5d0;
  CCoinsViewCache *in_stack_fffffffffffff5d8;
  uint local_9d0;
  int local_9cc;
  lazy_ostream local_9a8;
  undefined1 local_998 [14];
  undefined1 in_stack_fffffffffffff676;
  undefined1 in_stack_fffffffffffff677;
  CCoinsViewCache *in_stack_fffffffffffff678;
  TxValidationState *in_stack_fffffffffffff680;
  CTransaction *in_stack_fffffffffffff688;
  uint in_stack_fffffffffffff6c4;
  lazy_ostream local_928 [2];
  assertion_result local_908;
  assertion_result local_8d0;
  const_string local_8b8 [2];
  lazy_ostream local_898 [2];
  assertion_result local_878 [2];
  const_string local_840 [2];
  lazy_ostream local_820 [2];
  assertion_result local_800 [2];
  assertion_result local_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [70];
  lazy_ostream local_75a [3];
  PrecomputedTransactionData *in_stack_fffffffffffff8e0;
  ValidationCache *in_stack_fffffffffffff8e8;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *in_stack_fffffffffffff8f0;
  CoinsCachePair *local_8;
  
  fDeterministic = (undefined1)((ulong)in_stack_fffffffffffff590 >> 0x38);
  local_8 = *(CoinsCachePair **)(in_FS_OFFSET + 0x28);
  PrecomputedTransactionData::PrecomputedTransactionData
            ((PrecomputedTransactionData *)in_stack_fffffffffffff588);
  FastRandomContext::FastRandomContext(in_stack_fffffffffffff598,(bool)fDeterministic);
  for (local_9cc = 0; local_9cc < 10000; local_9cc = local_9cc + 1) {
    TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffff588);
    local_9d0 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5ac);
    if ((local_9d0 & 0x100) != 0) {
      local_9d0 = local_9d0 | 0x801;
    }
    if ((local_9d0 & 0x800) != 0) {
      local_9d0 = local_9d0 | 1;
    }
    CCoinsViewCache::CCoinsViewCache
              (in_stack_fffffffffffff5d8,(CCoinsView *)in_stack_fffffffffffff5d0,
               SUB81((ulong)in_stack_fffffffffffff5c8 >> 0x38,0));
    in_stack_fffffffffffff588 = &stack0xfffffffffffffed0;
    this = (char *)0x0;
    prev = in_R8;
    bVar1 = CheckInputScripts(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                              in_stack_fffffffffffff678,in_stack_fffffffffffff6c4,
                              (bool)in_stack_fffffffffffff677,(bool)in_stack_fffffffffffff676,
                              in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,
                              in_stack_fffffffffffff8f0);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_fffffffffffff588);
    local_75a[0]._vptr_lazy_ostream._0_1_ = ((local_9d0 & in_ESI) != 0 ^ 0xffU) & 1;
    local_75a[0]._vptr_lazy_ostream._1_1_ = bVar1;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this,(pointer)prev,
                 (unsigned_long)in_stack_fffffffffffff588);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff5c8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                 (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(prev,(char (*) [1])in_stack_fffffffffffff588);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this,(pointer)prev,
                 (unsigned_long)in_stack_fffffffffffff588);
      this = "expected_return_value";
      prev = local_75a;
      in_stack_fffffffffffff588 = "ret";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_7a0,local_7b0,0x95,1,2,
                 (undefined1 *)((long)&local_75a[0]._vptr_lazy_ostream + 1));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff588);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    if (((local_75a[0]._vptr_lazy_ostream._1_1_ & 1) == 0) || ((in_DL & 1) == 0)) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffff588);
      do {
        in_stack_fffffffffffff5d0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff5c8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                   (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
        in_stack_fffffffffffff5c8 = in_RDI;
        CCoinsViewCache::CCoinsViewCache
                  (in_stack_fffffffffffff5d8,(CCoinsView *)in_stack_fffffffffffff5d0,
                   SUB81((ulong)in_RDI >> 0x38,0));
        this = (char *)&local_8d0;
        pbVar2 = (basic_cstring<const_char> *)&stack0xfffffffffffffed0;
        prev = in_R8;
        in_stack_fffffffffffff5c7 =
             CheckInputScripts(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                               in_stack_fffffffffffff678,in_stack_fffffffffffff6c4,
                               (bool)in_stack_fffffffffffff677,(bool)in_stack_fffffffffffff676,
                               in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,
                               in_stack_fffffffffffff8f0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)this,SUB81((ulong)prev >> 0x38,0));
        in_stack_fffffffffffff5b8 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,(unsigned_long)pbVar2);
        boost::unit_test::operator<<(prev,pbVar2);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,(unsigned_long)pbVar2);
        in_stack_fffffffffffff588 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_908,local_928,(const_string *)&stack0xfffffffffffff6b8,0xa1,CHECK,
                   CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff588);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff588);
        CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_fffffffffffff588);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        in_stack_fffffffffffff5b0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff5c8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                   (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<(prev,(char (*) [1])in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        local_9a8._8_8_ =
             std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::size
                       ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                         *)in_stack_fffffffffffff588);
        local_9a8._vptr_lazy_ostream =
             (_func_int **)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff588);
        this = "tx.vin.size()";
        prev = &local_9a8;
        in_stack_fffffffffffff588 = "scriptchecks.size()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                  (&stack0xfffffffffffff678,local_998,0xa2,1,2,&local_9a8.m_empty);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff588);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)this
                );
    }
    else {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffff588);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff5c8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                   (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
        CCoinsViewCache::CCoinsViewCache
                  (in_stack_fffffffffffff5d8,(CCoinsView *)in_stack_fffffffffffff5d0,
                   SUB81((ulong)in_stack_fffffffffffff5c8 >> 0x38,0));
        this = (char *)&local_7c8;
        pbVar2 = (basic_cstring<const_char> *)&stack0xfffffffffffffed0;
        prev = in_R8;
        CheckInputScripts(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                          in_stack_fffffffffffff678,in_stack_fffffffffffff6c4,
                          (bool)in_stack_fffffffffffff677,(bool)in_stack_fffffffffffff676,
                          in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,
                          in_stack_fffffffffffff8f0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)this,SUB81((ulong)prev >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,(unsigned_long)pbVar2);
        boost::unit_test::operator<<(prev,pbVar2);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,(unsigned_long)pbVar2);
        in_stack_fffffffffffff588 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_800,local_820,local_840,0x9b,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff588);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff588);
        CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)in_stack_fffffffffffff588);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff5c8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
                   (size_t)in_stack_fffffffffffff5b8,(const_string *)in_stack_fffffffffffff5b0);
        std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::empty
                  ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                   this);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)this,SUB81((ulong)prev >> 0x38,0));
        in_stack_fffffffffffff5d8 = (CCoinsViewCache *)boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)in_stack_fffffffffffff588);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)this,(pointer)prev,
                   (unsigned_long)in_stack_fffffffffffff588);
        in_stack_fffffffffffff588 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_878,local_898,local_8b8,0x9c,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff588);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff588);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)this
                );
    }
    TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffff588);
  }
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffff588);
  PrecomputedTransactionData::~PrecomputedTransactionData
            ((PrecomputedTransactionData *)in_stack_fffffffffffff588);
  if (*(CoinsCachePair **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    PrecomputedTransactionData txdata;

    FastRandomContext insecure_rand(true);

    for (int count = 0; count < 10000; ++count) {
        TxValidationState state;

        // Randomly selects flag combinations
        uint32_t test_flags = (uint32_t) insecure_rand.randrange((SCRIPT_VERIFY_END_MARKER - 1) << 1);

        // Filter out incompatible flag choices
        if ((test_flags & SCRIPT_VERIFY_CLEANSTACK)) {
            // CLEANSTACK requires P2SH and WITNESS, see VerifyScript() in
            // script/interpreter.cpp
            test_flags |= SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS;
        }
        if ((test_flags & SCRIPT_VERIFY_WITNESS)) {
            // WITNESS requires P2SH
            test_flags |= SCRIPT_VERIFY_P2SH;
        }
        bool ret = CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, nullptr);
        // CheckInputScripts should succeed iff test_flags doesn't intersect with
        // failing_flags
        bool expected_return_value = !(test_flags & failing_flags);
        BOOST_CHECK_EQUAL(ret, expected_return_value);

        // Test the caching
        if (ret && add_to_cache) {
            // Check that we get a cache hit if the tx was valid
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK(scriptchecks.empty());
        } else {
            // Check that we get script executions to check, if the transaction
            // was invalid, or we didn't add to cache.
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK_EQUAL(scriptchecks.size(), tx.vin.size());
        }
    }
}